

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::PolicyOptionalWarningEnabled(cmMakefile *this,string *var)

{
  bool bVar1;
  ulong uVar2;
  char *val_00;
  cmake *this_00;
  bool local_39;
  cmake *cm;
  char *val;
  string *var_local;
  cmMakefile *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) && (val_00 = GetDefinition(this,var), val_00 != (char *)0x0)) {
    this_local._7_1_ = cmSystemTools::IsOn(val_00);
  }
  else {
    this_00 = GetCMakeInstance(this);
    bVar1 = cmake::GetDebugOutput(this_00);
    local_39 = true;
    if (!bVar1) {
      local_39 = cmake::GetTrace(this_00);
    }
    this_local._7_1_ = local_39;
  }
  return this_local._7_1_;
}

Assistant:

bool cmMakefile::PolicyOptionalWarningEnabled(std::string const& var)
{
  // Check for an explicit CMAKE_POLICY_WARNING_CMP<NNNN> setting.
  if(!var.empty())
    {
    if(const char* val = this->GetDefinition(var))
      {
      return cmSystemTools::IsOn(val);
      }
    }
  // Enable optional policy warnings with --debug-output or --trace.
  cmake* cm = this->GetCMakeInstance();
  return cm->GetDebugOutput() || cm->GetTrace();
}